

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall fasttext::Args::Args(Args *this)

{
  (this->input)._M_dataplus._M_p = (pointer)&(this->input).field_2;
  (this->input)._M_string_length = 0;
  (this->input).field_2._M_local_buf[0] = '\0';
  (this->test)._M_dataplus._M_p = (pointer)&(this->test).field_2;
  (this->test)._M_string_length = 0;
  (this->test).field_2._M_local_buf[0] = '\0';
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  (this->suboutput)._M_dataplus._M_p = (pointer)&(this->suboutput).field_2;
  (this->suboutput)._M_string_length = 0;
  (this->suboutput).field_2._M_local_buf[0] = '\0';
  (this->lemmaoutput)._M_dataplus._M_p = (pointer)&(this->lemmaoutput).field_2;
  (this->lemmaoutput)._M_string_length = 0;
  (this->lemmaoutput).field_2._M_local_buf[0] = '\0';
  (this->morphoutput)._M_dataplus._M_p = (pointer)&(this->morphoutput).field_2;
  (this->morphoutput)._M_string_length = 0;
  (this->morphoutput).field_2._M_local_buf[0] = '\0';
  (this->ipaoutput)._M_dataplus._M_p = (pointer)&(this->ipaoutput).field_2;
  (this->ipaoutput)._M_string_length = 0;
  (this->ipaoutput).field_2._M_local_buf[0] = '\0';
  (this->propsStr)._M_dataplus._M_p = (pointer)&(this->propsStr).field_2;
  (this->propsStr)._M_string_length = 0;
  (this->propsStr).field_2._M_local_buf[0] = '\0';
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  (this->pretrainedVectors)._M_dataplus._M_p = (pointer)&(this->pretrainedVectors).field_2;
  (this->pretrainedVectors)._M_string_length = 0;
  (this->pretrainedVectors).field_2._M_local_buf[0] = '\0';
  (this->props)._M_h._M_buckets = &(this->props)._M_h._M_single_bucket;
  (this->props)._M_h._M_bucket_count = 1;
  (this->props)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->props)._M_h._M_element_count = 0;
  (this->props)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->props)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->props)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->lr = 0.05;
  this->minCount = 5;
  this->neg = 5;
  this->wordNgrams = 1;
  this->loss = ns;
  this->model = sg;
  this->bucket = 2000000;
  this->thread = 0xc;
  this->lrUpdateRate = 100;
  this->dim = 100;
  this->ws = 5;
  this->epoch = 5;
  this->t = 0.0001;
  std::__cxx11::string::_M_replace((ulong)&this->label,0,(char *)0x0,0x11d470);
  this->verbose = 2;
  this->minn = 3;
  this->maxn = 6;
  std::__cxx11::string::_M_replace
            ((ulong)&this->pretrainedVectors,0,(char *)(this->pretrainedVectors)._M_string_length,
             0x11d69f);
  return;
}

Assistant:

Args::Args() {
  lr = 0.05;
  dim = 100;
  ws = 5;
  epoch = 5;
  minCount = 5;
  neg = 5;
  wordNgrams = 1;
  loss = loss_name::ns;
  model = model_name::sg;
  bucket = 2000000;
  thread = 12;
  lrUpdateRate = 100;
  t = 1e-4;
  label = "__label__";
  verbose = 2;
  minn = 3;
  maxn = 6;
  pretrainedVectors = "";
}